

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall soul::HEARTGenerator::~HEARTGenerator(HEARTGenerator *this)

{
  HEARTGenerator *this_local;
  
  ~HEARTGenerator(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

static void build (ArrayView<pool_ref<AST::ModuleBase>> sourceModules,
                       ArrayView<pool_ref<Module>> targetModules,
                       uint32_t maxNestedExpressionDepth = 255)
    {
        for (auto& m : sourceModules)
            SanityCheckPass::runPreHEARTGenChecks (m);

        std::vector<HEARTGenerator> generators;

        for (size_t i = 0; i < sourceModules.size(); ++i)
            generators.push_back ({ sourceModules[i], targetModules[i], maxNestedExpressionDepth });

        for (size_t i = 0; i < sourceModules.size(); ++i)
            generators[i].visitObject (sourceModules[i]);
    }